

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_rsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,RSA **rsa_ctx)

{
  bool bVar1;
  BIGNUM *pBVar2;
  int iVar3;
  int iVar4;
  BN_CTX *ctx;
  BIGNUM *r;
  BIGNUM *pBVar5;
  EVP_PKEY *pkey;
  char *errmsg;
  rsa_st *key;
  BIGNUM *local_e0;
  BIGNUM *local_c8;
  RSA *rsa;
  BIGNUM *local_b8;
  BIGNUM *q_1;
  BIGNUM *p_1;
  uchar *coeff;
  uchar *q;
  uchar *p;
  uchar *d;
  uchar *e;
  uchar *n;
  size_t coefflen;
  size_t qlen;
  size_t plen;
  size_t dlen;
  size_t elen;
  size_t nlen;
  uchar *comment;
  size_t commentlen;
  
  rsa = (RSA *)0x0;
  iVar3 = _libssh2_get_bignum_bytes(decrypted,&n,&nlen);
  if (iVar3 != 0) {
    errmsg = "RSA no n";
LAB_00112ad4:
    _libssh2_error(session,-0xe,errmsg);
    return -1;
  }
  iVar3 = _libssh2_get_bignum_bytes(decrypted,&e,&elen);
  if (iVar3 != 0) {
    errmsg = "RSA no e";
    goto LAB_00112ad4;
  }
  iVar3 = _libssh2_get_bignum_bytes(decrypted,&d,&dlen);
  if (iVar3 != 0) {
    errmsg = "RSA no d";
    goto LAB_00112ad4;
  }
  iVar3 = _libssh2_get_bignum_bytes(decrypted,&coeff,&coefflen);
  if (iVar3 != 0) {
    errmsg = "RSA no coeff";
    goto LAB_00112ad4;
  }
  iVar3 = _libssh2_get_bignum_bytes(decrypted,&p,&plen);
  if (iVar3 != 0) {
    errmsg = "RSA no p";
    goto LAB_00112ad4;
  }
  iVar3 = _libssh2_get_bignum_bytes(decrypted,&q,&qlen);
  if (iVar3 != 0) {
    errmsg = "RSA no q";
    goto LAB_00112ad4;
  }
  iVar3 = _libssh2_get_string(decrypted,&comment,&commentlen);
  if (iVar3 != 0) {
    errmsg = "RSA no comment";
    goto LAB_00112ad4;
  }
  _libssh2_rsa_new(&rsa,e,elen,n,nlen,d,dlen,p,plen,q,qlen,(uchar *)0x0,0,(uchar *)0x0,0,coeff,
                   coefflen);
  key = (rsa_st *)rsa;
  if (rsa == (RSA *)0x0) {
    key = (rsa_st *)0x0;
    iVar3 = 0;
    goto LAB_00112db8;
  }
  p_1 = (BIGNUM *)0x0;
  q_1 = (BIGNUM *)0x0;
  local_b8 = (BIGNUM *)0x0;
  RSA_get0_key(rsa,0,0);
  RSA_get0_factors(key,&p_1,&q_1);
  ctx = BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    iVar3 = -1;
    goto LAB_00112db8;
  }
  r = BN_new();
  if (r == (BIGNUM *)0x0) {
    iVar3 = -1;
    bVar1 = false;
    local_e0 = (BIGNUM *)0x0;
    local_c8 = (BIGNUM *)0x0;
  }
  else {
    local_c8 = BN_new();
    iVar3 = -1;
    if ((local_c8 == (BIGNUM *)0x0) ||
       (local_e0 = BN_new(), pBVar2 = q_1, local_e0 == (BIGNUM *)0x0)) {
      local_e0 = (BIGNUM *)0x0;
LAB_00112d41:
      bVar1 = false;
    }
    else {
      pBVar5 = BN_value_one();
      iVar4 = BN_sub(r,(BIGNUM *)pBVar2,pBVar5);
      if (iVar4 == 0) goto LAB_00112d41;
      bVar1 = false;
      iVar4 = BN_div((BIGNUM *)0x0,local_e0,local_b8,r,ctx);
      pBVar2 = p_1;
      if (iVar4 != 0) {
        pBVar5 = BN_value_one();
        iVar4 = BN_sub(r,(BIGNUM *)pBVar2,pBVar5);
        if (iVar4 == 0) goto LAB_00112d41;
        bVar1 = false;
        iVar4 = BN_div((BIGNUM *)0x0,local_c8,local_b8,r,ctx);
        if (iVar4 != 0) {
          RSA_set0_crt_params(key,local_c8,local_e0,0);
          bVar1 = true;
          iVar3 = 0;
        }
      }
    }
    BN_clear_free(r);
  }
  BN_CTX_free(ctx);
  if (!bVar1) {
    if (local_c8 != (BIGNUM *)0x0) {
      BN_clear_free(local_c8);
    }
    if (local_e0 != (BIGNUM *)0x0) {
      BN_clear_free(local_e0);
      key = (rsa_st *)rsa;
    }
  }
LAB_00112db8:
  if (((method != (uchar **)0x0) && (pubkeydata != (uchar **)0x0)) && (key != (rsa_st *)0x0)) {
    pkey = EVP_PKEY_new();
    EVP_PKEY_set1_RSA(pkey,key);
    iVar3 = gen_publickey_from_rsa_evp
                      (session,method,method_len,pubkeydata,pubkeydata_len,(EVP_PKEY *)pkey);
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
  }
  if (rsa_ctx != (RSA **)0x0) {
    *rsa_ctx = (RSA *)key;
    return iVar3;
  }
  RSA_free(key);
  return iVar3;
}

Assistant:

static int
gen_publickey_from_rsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                         struct string_buf *decrypted,
                                         unsigned char **method,
                                         size_t *method_len,
                                         unsigned char **pubkeydata,
                                         size_t *pubkeydata_len,
                                         libssh2_rsa_ctx **rsa_ctx)
{
    int rc = 0;
    size_t nlen, elen, dlen, plen, qlen, coefflen, commentlen;
    unsigned char *n, *e, *d, *p, *q, *coeff, *comment;
    RSA *rsa = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing RSA keys from private key data"));

    /* public key data */
    if(_libssh2_get_bignum_bytes(decrypted, &n, &nlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no n");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &e, &elen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no e");
        return -1;
    }

    /* private key data */
    if(_libssh2_get_bignum_bytes(decrypted, &d, &dlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no d");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &coeff, &coefflen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no coeff");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &p, &plen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no p");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &q, &qlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no q");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &comment, &commentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no comment");
        return -1;
    }

    rc = _libssh2_rsa_new(&rsa,
                          e, (unsigned long)elen,
                          n, (unsigned long)nlen,
                          d, (unsigned long)dlen,
                          p, (unsigned long)plen,
                          q, (unsigned long)qlen,
                          NULL, 0, NULL, 0,
                          coeff, (unsigned long)coefflen);
    if(rc) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Could not create RSA private key"));
        goto fail;
    }

    if(rsa)
        rc = _libssh2_rsa_new_additional_parameters(rsa);

    if(rsa && pubkeydata && method) {
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_RSA(pk, rsa);

        rc = gen_publickey_from_rsa_evp(session, method, method_len,
                                        pubkeydata, pubkeydata_len,
                                        pk);

        if(pk)
            EVP_PKEY_free(pk);
    }

    if(rsa_ctx)
        *rsa_ctx = rsa;
    else
        RSA_free(rsa);

    return rc;

fail:

    if(rsa)
        RSA_free(rsa);

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}